

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O1

bool Function_Template::form3_BitwiseOr(BitwiseOrForm3 BitwiseOr)

{
  ImageTemplate<unsigned_char> *this;
  uint8_t uVar1;
  bool bVar2;
  long lVar3;
  initializer_list<PenguinV_Image::ImageTemplate<unsigned_char>_> __l;
  uint32_t roiWidth;
  uint32_t roiHeight;
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  input;
  vector<unsigned_char,_std::allocator<unsigned_char>_> intensity;
  vector<unsigned_int,_std::allocator<unsigned_int>_> roiY;
  vector<unsigned_int,_std::allocator<unsigned_int>_> roiX;
  Image output;
  Image local_48;
  
  Unit_Test::intensityArray(&intensity,2);
  uVar1 = *intensity.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            ((ImageTemplate<unsigned_char> *)&roiX,0,0,'\x01','\x01');
  Test_Helper::uniformImage(&output,uVar1,0,0,(Image *)&roiX);
  uVar1 = intensity.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start[1];
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            ((ImageTemplate<unsigned_char> *)&roiY,0,0,'\x01','\x01');
  Test_Helper::uniformImage(&local_48,uVar1,0,0,(Image *)&roiY);
  __l._M_len = 2;
  __l._M_array = &output;
  std::
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ::vector(&input,__l,(allocator_type *)&roiWidth);
  lVar3 = 0x28;
  do {
    this = (ImageTemplate<unsigned_char> *)((long)&output._vptr_ImageTemplate + lVar3);
    this->_vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00219948;
    PenguinV_Image::ImageTemplate<unsigned_char>::clear(this);
    lVar3 = lVar3 + -0x28;
  } while (lVar3 != -0x28);
  roiY.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__ImageTemplate_00219948;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear((ImageTemplate<unsigned_char> *)&roiY);
  roiX.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__ImageTemplate_00219948;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear((ImageTemplate<unsigned_char> *)&roiX);
  roiX.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  roiX.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  roiX.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  roiY.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  roiY.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  roiY.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  Unit_Test::generateRoi(&input,&roiX,&roiY,&roiWidth,&roiHeight);
  (*BitwiseOr)(&output,input.
                       super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
               *roiX.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start,
               *roiY.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start,
               input.
               super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
               ._M_impl.super__Vector_impl_data._M_start + 1,
               roiX.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start[1],
               roiY.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start[1],roiWidth,roiHeight);
  bVar2 = Unit_Test::equalSize(&output,roiWidth,roiHeight);
  if (bVar2) {
    bVar2 = Unit_Test::verifyImage
                      (&output,intensity.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start[1] |
                               *intensity.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
  }
  else {
    bVar2 = false;
  }
  output._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00219948;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&output);
  if (roiY.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(roiY.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (roiX.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(roiX.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ::~vector(&input);
  if (intensity.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(intensity.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return bVar2;
}

Assistant:

bool form3_BitwiseOr(BitwiseOrForm3 BitwiseOr)
    {
        const std::vector < uint8_t > intensity = intensityArray( 2 );
        const std::vector < PenguinV_Image::Image > input = { uniformImage( intensity[0] ), uniformImage( intensity[1] ) };

        std::vector < uint32_t > roiX, roiY;
        uint32_t roiWidth, roiHeight;
        generateRoi( input, roiX, roiY, roiWidth, roiHeight );

        const PenguinV_Image::Image output = BitwiseOr( input[0], roiX[0], roiY[0], input[1], roiX[1], roiY[1], roiWidth, roiHeight );

        return equalSize( output, roiWidth, roiHeight ) && verifyImage( output, intensity[0] | intensity[1] );
    }